

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qual_hostname.c
# Opt level: O2

int get_self_ip_addr(void *cm,CMtrans_services_conflict svc)

{
  ushort uVar1;
  sockaddr *psVar2;
  CMTransport_trace p_Var3;
  int iVar4;
  int iVar5;
  in_addr_t iVar6;
  hostent *phVar7;
  anon_union_8_2_d20b7a2c_for_ifc_ifcu __ptr;
  ulong uVar8;
  char *pcVar9;
  char **ppcVar10;
  ifaddrs *piVar11;
  in_addr *in;
  uint *puVar12;
  char *pcVar13;
  anon_union_8_2_d20b7a2c_for_ifc_ifcu aVar14;
  uint uVar15;
  uint uVar16;
  ifaddrs *if_addrs;
  anon_union_8_2_d20b7a2c_for_ifc_ifcu local_180;
  ifconf ifaces;
  char buf [46];
  char hostname_buf [256];
  
  piVar11 = (ifaddrs *)&if_addrs;
  if_addrs = (ifaddrs *)0x0;
  iVar4 = getifaddrs(piVar11);
  if (iVar4 == 0) {
    while (piVar11 = piVar11->ifa_next, piVar11 != (ifaddrs *)0x0) {
      psVar2 = piVar11->ifa_addr;
      if (psVar2 != (sockaddr *)0x0) {
        uVar1 = psVar2->sa_family;
        if ((uVar1 & 0xfff7) == 2 && svc != (CMtrans_services_conflict)0x0) {
          p_Var3 = svc->trace_out;
          pcVar13 = piVar11->ifa_name;
          pcVar9 = inet_ntop((uint)uVar1,psVar2->sa_data + (ulong)(uVar1 != 2) * 4 + 2,buf,0x2e);
          (*p_Var3)((CManager)cm,"CM<transport> IP possibility -> %s : %s",pcVar13,pcVar9);
        }
      }
    }
    pcVar13 = getenv("CM_INTERFACE");
    if (pcVar13 != (char *)0x0) {
      piVar11 = (ifaddrs *)&if_addrs;
      do {
        do {
          piVar11 = piVar11->ifa_next;
          if (piVar11 == (ifaddrs *)0x0) {
            printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
                   ,pcVar13);
            goto LAB_001030fb;
          }
          psVar2 = piVar11->ifa_addr;
        } while ((psVar2 == (sockaddr *)0x0) || (psVar2->sa_family != 2));
        pcVar9 = piVar11->ifa_name;
        iVar4 = strcmp(pcVar9,pcVar13);
      } while (iVar4 != 0);
      if (svc != (CMtrans_services_conflict)0x0) {
        p_Var3 = svc->trace_out;
        pcVar13 = inet_ntop(2,psVar2->sa_data + 2,buf,0x2e);
        (*p_Var3)((CManager)cm,"CM<transport> Interface specified, returning ->%s : %s",pcVar9,
                  pcVar13);
      }
      freeifaddrs(if_addrs);
      uVar16 = *(uint *)(psVar2->sa_data + 2);
      goto LAB_00103174;
    }
LAB_001030fb:
    gethostname(hostname_buf,0x100);
    phVar7 = gethostbyname(hostname_buf);
    if (phVar7 == (hostent *)0x0) {
LAB_0010317c:
      piVar11 = (ifaddrs *)&if_addrs;
      while (piVar11 = piVar11->ifa_next, piVar11 != (ifaddrs *)0x0) {
        psVar2 = piVar11->ifa_addr;
        if (((psVar2 != (sockaddr *)0x0) && (psVar2->sa_family == 2)) &&
           ((piVar11->ifa_flags & 8) == 0)) {
          if (svc != (CMtrans_services_conflict)0x0) {
            p_Var3 = svc->trace_out;
            pcVar13 = piVar11->ifa_name;
            pcVar9 = inet_ntop(2,psVar2->sa_data + 2,buf,0x2e);
            (*p_Var3)((CManager)cm,"CM<transport> get_self_ip_addr returning first avail -> %s : %s"
                      ,pcVar13,pcVar9);
          }
          uVar16 = *(uint *)(psVar2->sa_data + 2);
          freeifaddrs(if_addrs);
          return uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
          ;
        }
      }
      goto LAB_00102dcc;
    }
    ppcVar10 = phVar7->h_addr_list;
    do {
      puVar12 = (uint *)*ppcVar10;
      if (puVar12 == (uint *)0x0) goto LAB_0010317c;
      uVar16 = *puVar12;
      ppcVar10 = ppcVar10 + 1;
    } while ((char)uVar16 == '\x7f');
    if (svc != (CMtrans_services_conflict)0x0) {
      (*svc->trace_out)((CManager)cm,
                        "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
                        (ulong)(uVar16 & 0xff),(ulong)(uVar16 >> 8 & 0xff),
                        (ulong)(uVar16 >> 0x10 & 0xff),(ulong)(uVar16 >> 0x18));
    }
    freeifaddrs(if_addrs);
  }
  else {
LAB_00102dcc:
    if (if_addrs != (ifaddrs *)0x0) {
      freeifaddrs();
    }
    gethostname(hostname_buf,0x100);
    phVar7 = gethostbyname(hostname_buf);
    if (phVar7 == (hostent *)0x0) {
LAB_00102e69:
      uVar16 = 0;
      iVar4 = socket(2,2,0);
      ifaces.ifc_len = 0xa00;
      __ptr.ifcu_buf = (__caddr_t)malloc(0xa00);
      ifaces.ifc_ifcu.ifcu_buf = __ptr.ifcu_buf;
      iVar5 = ioctl(iVar4,0x8912,&ifaces);
      if (-1 < iVar5) {
        uVar16 = 0;
        uVar8 = (ulong)(long)ifaces.ifc_len / 0x28;
        aVar14 = ifaces.ifc_ifcu;
        local_180.ifcu_buf = __ptr.ifcu_buf;
        while (iVar5 = (int)uVar8, uVar8 = (ulong)(iVar5 - 1), __ptr = local_180, iVar5 != 0) {
          ioctl(iVar4,0x8913,aVar14.ifcu_buf);
          uVar1 = ((aVar14.ifcu_req)->ifr_ifru).ifru_addr.sa_family;
          if ((uVar1 & 8) == 0) {
            if ((uVar1 & 1) == 0) {
              pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, not UP";
              goto LAB_00102f07;
            }
            if ((uVar1 & 0x40) == 0) {
              pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, not RUNNING";
              goto LAB_00102f07;
            }
            uVar15 = *(uint *)((long)&(aVar14.ifcu_req)->ifr_ifru + 4);
            if ((uVar15 != 0) && (uVar15 != 0x7f000001)) {
              uVar16 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 << 0x18;
              __ptr = local_180;
              if (svc != (CMtrans_services_conflict)0x0) {
                (*svc->trace_out)((CManager)cm,
                                  "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
                                  (ulong)uVar16,(ulong)(uVar15 & 0xff),(ulong)(uVar15 >> 8 & 0xff),
                                  (ulong)(uVar15 >> 0x10 & 0xff),uVar15 >> 0x18);
                __ptr = local_180;
              }
              break;
            }
          }
          else {
            pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, loopback";
LAB_00102f07:
            if (svc != (CMtrans_services_conflict)0x0) {
              uVar15 = *(uint *)((long)&(aVar14.ifcu_req)->ifr_ifru + 4);
              (*svc->trace_out)((CManager)cm,pcVar13,
                                (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 |
                                        (uVar15 & 0xff00) << 8 | uVar15 << 0x18));
            }
          }
          aVar14.ifcu_buf = aVar14.ifcu_buf + 0x28;
        }
      }
      close(iVar4);
      free(__ptr.ifcu_buf);
      if (uVar16 != 0) {
        return uVar16;
      }
      pcVar13 = getenv("CM_LAST_RESORT_IP_ADDR");
      if (svc == (CMtrans_services_conflict)0x0) {
        if (pcVar13 == (char *)0x0) {
          return 0;
        }
      }
      else {
        (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr at last resort");
        if (pcVar13 == (char *)0x0) {
          return 0;
        }
        (*svc->trace_out)((CManager)cm,"CM<transport> - Translating last resort %s",pcVar13);
      }
      iVar6 = inet_addr(pcVar13);
      return iVar6;
    }
    ppcVar10 = phVar7->h_addr_list;
    do {
      puVar12 = (uint *)*ppcVar10;
      if (puVar12 == (uint *)0x0) goto LAB_00102e69;
      uVar16 = *puVar12;
      uVar15 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      ppcVar10 = ppcVar10 + 1;
    } while (uVar16 << 0x18 == 0x7f000000);
    if (svc == (CMtrans_services_conflict)0x0) {
      return uVar15;
    }
    (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
                      (ulong)uVar15,(ulong)(uVar16 & 0xff),(ulong)(uVar16 >> 8 & 0xff),
                      (ulong)(uVar16 >> 0x10 & 0xff),uVar16 >> 0x18);
  }
  uVar16 = *puVar12;
LAB_00103174:
  return uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
}

Assistant:

static int
get_self_ip_addr(void *cm, CMtrans_services svc)
{
    struct hostent *host;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
        char *interface;
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    if (svc) {
	        svc->trace_out(cm, "CM<transport> IP possibility -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if ((interface = getenv("CM_INTERFACE")) != NULL) {
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strcmp(if_addr->ifa_name, interface) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		if (svc) {
		    svc->trace_out(cm, "CM<transport> Interface specified, returning ->%s : %s",
				   if_addr->ifa_name,
				   inet_ntop(family, tmp, buf, sizeof(buf)));
		}
		freeifaddrs(if_addrs);
		return (ntohl(*(uint32_t*)tmp));
	    }
	    printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n", interface);
	}
	    
	gethostname(hostname_buf, sizeof(hostname_buf));
	host = gethostbyname(hostname_buf);
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    if (svc)
			svc->trace_out(cm, "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
				       *((unsigned char *) &in->s_addr),
				       *(((unsigned char *) &in->s_addr) + 1),
				       *(((unsigned char *) &in->s_addr) + 2),
				       *(((unsigned char *) &in->s_addr) + 3));
		    freeifaddrs(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    if (svc) {
		svc->trace_out(cm, "CM<transport> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    freeifaddrs(if_addrs);
	    return ret_ip;
	}
    }
    if (if_addrs) freeifaddrs(if_addrs);
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    host = gethostbyname(hostname_buf);
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
				   ntohl(in->s_addr),
				   *((unsigned char *) &in->s_addr),
				   *(((unsigned char *) &in->s_addr) + 1),
				   *(((unsigned char *) &in->s_addr) + 2),
				   *(((unsigned char *) &in->s_addr) + 3));
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, loopback",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not UP",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not RUNNING",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
			       ntohl(sai->sin_addr.s_addr),
			       *((unsigned char *) &sai->sin_addr.s_addr),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 1),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 2),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 3));
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv("CM_LAST_RESORT_IP_ADDR");
	if (svc)
	    svc->trace_out(cm, "CM<transport> - Get self IP addr at last resort");
	if (c != NULL) {
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}